

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

bool icu_63::number::impl::GeneratorHelpers::perUnit
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  UErrorCode *this;
  bool bVar1;
  ConstChar16Ptr local_30;
  UErrorCode *local_28;
  UErrorCode *status_local;
  UnicodeString *sb_local;
  MacroProps *macros_local;
  
  local_28 = status;
  status_local = (UErrorCode *)sb;
  sb_local = (UnicodeString *)macros;
  bVar1 = utils::unitIsNoUnit(&macros->perUnit);
  if (bVar1) {
    bVar1 = utils::unitIsPercent((MeasureUnit *)((long)&sb_local->fUnion + 0x20));
    if ((!bVar1) &&
       (bVar1 = utils::unitIsPermille((MeasureUnit *)((long)&sb_local->fUnion + 0x20)), !bVar1)) {
      return false;
    }
    *local_28 = U_UNSUPPORTED_ERROR;
    macros_local._7_1_ = false;
  }
  else {
    bVar1 = utils::unitIsCurrency((MeasureUnit *)((long)&sb_local->fUnion + 0x20));
    this = status_local;
    if (bVar1) {
      *local_28 = U_UNSUPPORTED_ERROR;
      macros_local._7_1_ = false;
    }
    else {
      ConstChar16Ptr::ConstChar16Ptr(&local_30,L"per-measure-unit/");
      UnicodeString::append((UnicodeString *)this,&local_30,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_30);
      blueprint_helpers::generateMeasureUnitOption
                ((MeasureUnit *)((long)&sb_local->fUnion + 0x20),(UnicodeString *)status_local,
                 local_28);
      macros_local._7_1_ = true;
    }
  }
  return macros_local._7_1_;
}

Assistant:

bool GeneratorHelpers::perUnit(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    // Per-units are currently expected to be only MeasureUnits.
    if (utils::unitIsNoUnit(macros.perUnit)) {
        if (utils::unitIsPercent(macros.perUnit) || utils::unitIsPermille(macros.perUnit)) {
            status = U_UNSUPPORTED_ERROR;
            return false;
        } else {
            // Default value: ok to ignore
            return false;
        }
    } else if (utils::unitIsCurrency(macros.perUnit)) {
        status = U_UNSUPPORTED_ERROR;
        return false;
    } else {
        sb.append(u"per-measure-unit/", -1);
        blueprint_helpers::generateMeasureUnitOption(macros.perUnit, sb, status);
        return true;
    }
}